

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O2

int fetch_all_feed_info_db(feed_db_t *db,feed_info_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  feed_info_t *pfVar4;
  uchar *puVar5;
  long lVar6;
  sqlite3_stmt *stmt;
  uint local_2f0;
  feed_info_t record;
  char qr [158];
  
  uVar2 = count_rows_db(db,"feed_info");
  if (0 < (int)uVar2) {
    memcpy(qr,
           "SELECT feed_publisher_name, feed_publisher_url, feed_lang,feed_start_date, feed_end_date, feed_version,feed_contact_email, feed_contact_url FROM `feed_info`;"
           ,0x9e);
    sqlite3_prepare_v2(db->conn,qr,-1,&stmt,(char **)0x0);
    pfVar4 = (feed_info_t *)malloc((ulong)uVar2 * 0x212);
    *records = pfVar4;
    uVar1 = 0xffffffff;
    if (pfVar4 != (feed_info_t *)0x0) {
      lVar6 = 0;
      local_2f0 = uVar2;
      do {
        iVar3 = sqlite3_step(stmt);
        db->rc = iVar3;
        uVar1 = local_2f0;
        if (iVar3 != 100) break;
        init_feed_info(&record);
        puVar5 = sqlite3_column_text(stmt,0);
        strcpy(record.feed_publisher_name,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,1);
        strcpy(record.feed_publisher_url,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,2);
        strcpy(record.feed_lang,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,3);
        strcpy(record.feed_start_date,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,4);
        strcpy(record.feed_end_date,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,5);
        strcpy(record.feed_version,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,6);
        strcpy(record.feed_contact_email,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,7);
        strcpy(record.feed_contact_url,(char *)puVar5);
        memcpy((*records)->feed_publisher_name + lVar6,&record,0x212);
        lVar6 = lVar6 + 0x212;
        uVar1 = local_2f0;
      } while ((ulong)uVar2 * 0x212 - lVar6 != 0);
    }
    uVar2 = uVar1;
    sqlite3_finalize(stmt);
  }
  return uVar2;
}

Assistant:

int fetch_all_feed_info_db(feed_db_t *db, feed_info_t **records) {

    feed_info_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "feed_info");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "feed_publisher_name, feed_publisher_url, feed_lang,"
                    "feed_start_date, feed_end_date, feed_version,"
                    "feed_contact_email, feed_contact_url "
                "FROM `feed_info`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_feed_info(&record);

        strcpy(record.feed_publisher_name, sqlite3_column_text(stmt, 0));
        strcpy(record.feed_publisher_url, sqlite3_column_text(stmt, 1));
        strcpy(record.feed_lang, sqlite3_column_text(stmt, 2));
        strcpy(record.feed_start_date, sqlite3_column_text(stmt, 3));
        strcpy(record.feed_end_date, sqlite3_column_text(stmt, 4));
        strcpy(record.feed_version, sqlite3_column_text(stmt, 5));
        strcpy(record.feed_contact_email, sqlite3_column_text(stmt, 6));
        strcpy(record.feed_contact_url, sqlite3_column_text(stmt, 7));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}